

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.h
# Opt level: O0

istream * jaegertracing::net::http::readLineCRLF(istream *in,string *line)

{
  bool bVar1;
  long *plVar2;
  bool sawCR;
  char ch;
  string *line_local;
  istream *in_local;
  
  std::__cxx11::string::clear();
  while( true ) {
    plVar2 = (long *)std::istream::get((char *)in);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::__cxx11::string::push_back((char)line);
  }
  return in;
}

Assistant:

inline std::istream& readLineCRLF(std::istream& in, std::string& line)
{
    line.clear();
    auto ch = '\0';
    auto sawCR = false;
    while (in.get(ch)) {
        if (sawCR) {
            if (ch == '\n') {
                break;
            }
            else {
                line.push_back('\r');
                line.push_back(ch);
                sawCR = false;
            }
        }
        else {
            if (ch == '\r') {
                sawCR = true;
            }
            else {
                line.push_back(ch);
            }
        }
    }

    return in;
}